

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::anon_unknown_0::PassNullTest::iterate(PassNullTest *this)

{
  undefined8 log_00;
  deUint32 dVar1;
  deBool dVar2;
  EGLBoolean got;
  Library *egl_00;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  ScopedLogSection local_58 [3];
  undefined4 local_3c;
  undefined1 local_38 [4];
  int bufferAge;
  CallLogWrapper wrapper;
  TestLog *log;
  Library *egl;
  PassNullTest *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  wrapper._16_8_ =
       tcu::TestContext::getLog
                 ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx);
  eglu::CallLogWrapper::CallLogWrapper((CallLogWrapper *)local_38,egl_00,(TestLog *)wrapper._16_8_);
  local_3c = 0xffffffff;
  eglu::CallLogWrapper::enableLogging((CallLogWrapper *)local_38,true);
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  log_00 = wrapper._16_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Test6",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"If pass (null, 0) to setDamageRegion(), no error",&local_a1);
  tcu::ScopedLogSection::ScopedLogSection(local_58,(TestLog *)log_00,&local_78,&local_a0);
  tcu::ScopedLogSection::~ScopedLogSection(local_58);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  do {
    (*egl_00->_vptr_Library[0x30])
              (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
    dVar1 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x1db);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    (*egl_00->_vptr_Library[0x2b])
              (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d);
    dVar1 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x1dc);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  got = eglu::CallLogWrapper::eglSetDamageRegionKHR
                  ((CallLogWrapper *)local_38,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                   (this->super_NegativePartialUpdateTest).m_eglSurface,(EGLint *)0x0,0);
  NegativePartialUpdateTest::expectTrue(&this->super_NegativePartialUpdateTest,got);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3000);
  eglu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_38);
  return STOP;
}

Assistant:

TestCase::IterateResult PassNullTest::iterate (void)
{
	const Library&			egl				= m_eglTestCtx.getLibrary();
	TestLog&				log				= m_testCtx.getLog();
	CallLogWrapper			wrapper			(egl, log);
	int						bufferAge		= -1;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	{
		tcu::ScopedLogSection(log, "Test6", "If pass (null, 0) to setDamageRegion(), no error");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
		expectTrue(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0));
		expectError(EGL_SUCCESS);
	}

	return STOP;
}